

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O2

void __thiscall MatchTable::generate(MatchTable *this)

{
  pointer ppcVar1;
  pointer ppcVar2;
  RegexTree local_60;
  MatchTool local_58;
  
  ppcVar1 = (this->regs).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar2 = (this->regs).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppcVar2 != ppcVar1; ppcVar2 = ppcVar2 + 1
      ) {
    RegexTree::RegexTree(&local_60,*ppcVar2);
    generate_Dtran(&local_58,&local_60);
    std::vector<MatchTool,_std::allocator<MatchTool>_>::emplace_back<MatchTool>
              (&this->tools,&local_58);
    MatchTool::~MatchTool(&local_58);
    RegexTree::~RegexTree(&local_60);
  }
  return;
}

Assistant:

void MatchTable::generate() {
    for (const char* str : regs) {
        tools.push_back(generate_Dtran(RegexTree(str)));
    }
}